

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::Sign(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  Vector3_d local_38;
  
  local_38.c_[0] = b->c_[2] * a->c_[1] - a->c_[2] * b->c_[1];
  local_38.c_[1] = b->c_[0] * a->c_[2] - a->c_[0] * b->c_[2];
  local_38.c_[2] = b->c_[1] * a->c_[0] - a->c_[1] * b->c_[0];
  iVar1 = TriageSign(a,b,c,&local_38);
  if (iVar1 == 0) {
    iVar1 = ExpensiveSign(a,b,c,true);
  }
  return iVar1;
}

Assistant:

int Sign(const S2Point& a, const S2Point& b, const S2Point& c) {
  // We don't need RobustCrossProd() here because Sign() does its own
  // error estimation and calls ExpensiveSign() if there is any uncertainty
  // about the result.
  return Sign(a, b, c, a.CrossProd(b));
}